

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O2

REF_STATUS ref_sort_in_place_glob(REF_INT n,REF_GLOB *sorts)

{
  REF_STATUS RVar1;
  REF_INT *sorted_index;
  void *__ptr;
  ulong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  ulong uVar5;
  
  RVar1 = 0;
  if (1 < n) {
    uVar5 = (ulong)(uint)n;
    sorted_index = (REF_INT *)malloc(uVar5 * 4);
    if (sorted_index == (REF_INT *)0x0) {
      pcVar4 = "malloc order of REF_INT NULL";
      uVar3 = 199;
    }
    else {
      __ptr = malloc(uVar5 * 8);
      if (__ptr != (void *)0x0) {
        ref_sort_heap_glob(n,sorts,sorted_index);
        for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
          *(REF_GLOB *)((long)__ptr + uVar2 * 8) = sorts[sorted_index[uVar2]];
        }
        for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
          sorts[uVar2] = *(REF_GLOB *)((long)__ptr + uVar2 * 8);
        }
        free(__ptr);
        free(sorted_index);
        return 0;
      }
      pcVar4 = "malloc sorted of REF_GLOB NULL";
      uVar3 = 200;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort.c",uVar3,
           "ref_sort_in_place_glob",pcVar4);
    RVar1 = 2;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_sort_in_place_glob(REF_INT n, REF_GLOB *sorts) {
  REF_INT i;
  REF_INT *order;
  REF_GLOB *sorted;

  /* see if it is too short to require sorting */
  if (2 > n) return REF_SUCCESS;
  ref_malloc(order, n, REF_INT);
  ref_malloc(sorted, n, REF_GLOB);
  RSS(ref_sort_heap_glob(n, sorts, order), "heap");
  for (i = 0; i < n; i++) {
    sorted[i] = sorts[order[i]];
  }
  for (i = 0; i < n; i++) {
    sorts[i] = sorted[i];
  }
  ref_free(sorted);
  ref_free(order);
  return REF_SUCCESS;
}